

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseFilters::TestCaseFilters(TestCaseFilters *this,TestCaseFilters *param_1)

{
  TestCaseFilters *param_1_local;
  TestCaseFilters *this_local;
  
  std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::vector
            (&this->m_tagExpressions,&param_1->m_tagExpressions);
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::vector
            (&this->m_inclusionFilters,&param_1->m_inclusionFilters);
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::vector
            (&this->m_exclusionFilters,&param_1->m_exclusionFilters);
  std::__cxx11::string::string((string *)&this->m_name,(string *)&param_1->m_name);
  return;
}

Assistant:

TestCaseFilters( std::string const& name ) : m_name( name ) {}